

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O1

Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
__thiscall Kernel::PolyNf::wrapPoly<Kernel::NumTraits<Kernel::IntegerConstantType>>(PolyNf *this)

{
  byte bVar1;
  ulong uVar2;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *extraout_RDX;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *extraout_RDX_00;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_RSI;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *r;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  PVar3;
  anon_class_16_2_f84bbffd f;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_58;
  ulong local_38 [4];
  
  bVar1 = (byte)(in_RSI->_summands)._capacity;
  if ((bVar1 & 3) == 2) {
    *(undefined4 *)
     &(this->super_PolyNfSuper)._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
         = *(undefined4 *)((long)&(in_RSI->_summands)._capacity + 2);
    *(undefined8 *)
     ((this->super_PolyNfSuper)._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content + 7) = *(undefined8 *)((long)&(in_RSI->_summands)._stack + 2);
  }
  else {
    local_38[1] = 0;
    local_38[2] = 0;
    local_38[0] = (ulong)bVar1 & 0xffffffffffffff03;
    f.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
               *)in_RSI;
    f.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
              *)local_38;
    ::Lib::CoproductImpl::
    RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
    ::
    switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
              ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                *)local_38,f);
    Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Polynom(&local_58,(PolyNf *)local_38);
    PVar3 = ::Lib::
            perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>
                      ((Lib *)this,&local_58);
    in_RSI = PVar3._ptr;
    r = local_58._summands._cursor;
    while (r != local_58._summands._stack) {
      r = r + -1;
      mpz_clear((__mpz_struct *)r);
      in_RSI = extraout_RDX;
    }
    if (local_58._summands._stack != (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0)
    {
      uVar2 = local_58._summands._capacity << 5;
      if (uVar2 == 0) {
        ((local_58._summands._stack)->numeral)._val[0]._mp_alloc =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
        ((local_58._summands._stack)->numeral)._val[0]._mp_size =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_58._summands._stack;
      }
      else if (uVar2 < 0x21) {
        ((local_58._summands._stack)->numeral)._val[0]._mp_alloc =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
        ((local_58._summands._stack)->numeral)._val[0]._mp_size =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_58._summands._stack;
      }
      else if (uVar2 < 0x31) {
        ((local_58._summands._stack)->numeral)._val[0]._mp_alloc =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
        ((local_58._summands._stack)->numeral)._val[0]._mp_size =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_58._summands._stack;
      }
      else if (uVar2 < 0x41) {
        ((local_58._summands._stack)->numeral)._val[0]._mp_alloc =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
        ((local_58._summands._stack)->numeral)._val[0]._mp_size =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_58._summands._stack;
      }
      else {
        operator_delete(local_58._summands._stack,0x10);
        in_RSI = extraout_RDX_00;
      }
    }
  }
  PVar3._ptr = in_RSI;
  PVar3._0_8_ = this;
  return PVar3;
}

Assistant:

Perfect<Polynom<Number>> PolyNf::wrapPoly() const
{
  if (this->is<AnyPoly>()) {
    return this->unwrap<AnyPoly>()
            .unwrap<Perfect<Polynom<Number>>>();
  } else {
    return perfect(Polynom<Number>(*this));
  }
}